

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindowSettings * ImGui::FindWindowSettings(ImGuiID id)

{
  ImGuiWindowSettings *pIVar1;
  ImVector<ImGuiWindowSettings> *this;
  int i;
  
  this = &GImGui->SettingsWindows;
  i = 0;
  while( true ) {
    if (i == this->Size) {
      return (ImGuiWindowSettings *)0x0;
    }
    pIVar1 = ImVector<ImGuiWindowSettings>::operator[](this,i);
    if (pIVar1->ID == id) break;
    i = i + 1;
  }
  pIVar1 = ImVector<ImGuiWindowSettings>::operator[](this,i);
  return pIVar1;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettings(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (int i = 0; i != g.SettingsWindows.Size; i++)
        if (g.SettingsWindows[i].ID == id)
            return &g.SettingsWindows[i];
    return NULL;
}